

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

void duckdb::IEJoinUnion::Sort(SortedTable *table)

{
  GlobalSortState *this;
  MergeSorter merge_sorter;
  
  this = &table->global_sort_state;
  GlobalSortState::PrepareMergePhase(this);
  while (8 < (ulong)((long)(table->global_sort_state).sorted_blocks.
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(table->global_sort_state).sorted_blocks.
                          super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    GlobalSortState::InitializeMergeRound(this);
    MergeSorter::MergeSorter(&merge_sorter,this,(table->global_sort_state).buffer_manager);
    MergeSorter::PerformInMergeRound(&merge_sorter);
    GlobalSortState::CompleteMergeRound(this,true);
    MergeSorter::~MergeSorter(&merge_sorter);
  }
  return;
}

Assistant:

static void Sort(SortedTable &table) {
		auto &global_sort_state = table.global_sort_state;
		global_sort_state.PrepareMergePhase();
		while (global_sort_state.sorted_blocks.size() > 1) {
			global_sort_state.InitializeMergeRound();
			MergeSorter merge_sorter(global_sort_state, global_sort_state.buffer_manager);
			merge_sorter.PerformInMergeRound();
			global_sort_state.CompleteMergeRound(true);
		}
	}